

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.hpp
# Opt level: O0

bool __thiscall
Inferences::OverlayBinder::tryGetBinding(OverlayBinder *this,Var var,TermList *result)

{
  bool bVar1;
  pointer pvVar2;
  uint64_t *in_RDX;
  unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
  *in_RDI;
  const_iterator o_it;
  const_iterator b_it;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_28;
  uint64_t *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
       ::find(in_RDI,(key_type *)0x774c95);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
       ::end(in_RDI);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>
                         *)0x774cc7);
    *local_20 = (pvVar2->second)._content;
    local_1 = true;
  }
  else {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
         ::find(in_RDI,(key_type *)0x774cef);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
         ::end(in_RDI);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>
                           *)0x774d25);
      *local_20 = (pvVar2->second)._content;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool tryGetBinding(Var var, TermList& result) const
    {
      auto b_it = m_base.find(var);
      if (b_it != m_base.end()) {
        // var has base binding
        result = b_it->second;
        return true;
      } else {
        auto o_it = m_overlay.find(var);
        if (o_it != m_overlay.end()) {
          // var has overlay binding
          result = o_it->second;
          return true;
        } else {
          // var is unbound
          return false;
        }
      }
    }